

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt.hpp
# Opt level: O3

void tl::printError<char_const*>(char **args)

{
  tl *this;
  u32 uVar1;
  u32 uVar2;
  char *pcVar3;
  CStr str_00;
  CStr str_01;
  CStr str_02;
  CStr str_03;
  CStr str_04;
  Str str;
  CStrT<char> local_68;
  StrT<char> local_58;
  CStrT<char> local_48;
  uint local_38;
  
  this = _stderr;
  CStrT<char>::CStrT(&local_48,*args);
  str_00._0_8_ = local_48._0_8_ & 0xffffffff;
  str_00._str = local_48._str;
  uVar1 = calcToStringLengthT(str_00);
  CStrT<char>::CStrT(&local_48,"\n");
  str_01._0_8_ = local_48._0_8_ & 0xffffffff;
  str_01._str = local_48._str;
  uVar2 = calcToStringLengthT(str_01);
  StrT<char>::StrT(&local_58,uVar1 + uVar2,'.');
  local_38 = uVar1 + uVar2 + 1;
  pcVar3 = (char *)(ulong)local_38;
  local_48._0_8_ = local_58._str;
  local_48._str = local_58._str;
  CStrT<char>::CStrT(&local_68,*args);
  str_02._str = pcVar3;
  str_02._0_8_ = local_68._str;
  toStringBufferT((tl *)&local_48,(FmtBuffer *)(ulong)local_68._size,str_02);
  CStrT<char>::CStrT(&local_68,"\n");
  str_03._str = pcVar3;
  str_03._0_8_ = local_68._str;
  toStringBufferT((tl *)&local_48,(FmtBuffer *)(ulong)local_68._size,str_03);
  local_48._str[-(ulong)(local_38 == 0)] = '\0';
  CStrT<char>::CStrT(&local_48,&local_58);
  str_04._str = pcVar3;
  str_04._0_8_ = local_48._str;
  fprintCStr(this,(FILE *)(local_48._0_8_ & 0xffffffff),str_04);
  StrT<char>::~StrT(&local_58);
  return;
}

Assistant:

static void printError(const Args&... args)
{
    fprint(stderr, args..., "\n");
}